

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O1

void bloaty::wasm::ParseSections(RangeSink *sink)

{
  char *pcVar1;
  string_view name;
  string_view local_80;
  Section local_70;
  
  local_80._M_len = (sink->file_->data_)._M_len;
  local_80._M_str = (sink->file_->data_)._M_str;
  ReadMagic(&local_80);
  if (local_80._M_len != 0) {
    do {
      Section::Read(&local_70,&local_80);
      pcVar1 = (sink->file_->data_)._M_str;
      if ((pcVar1 <= local_70.data._M_str) &&
         (local_70.data._M_str < pcVar1 + (sink->file_->data_)._M_len)) {
        name._M_str = local_70.name._M_dataplus._M_p;
        name._M_len = local_70.name._M_string_length;
        RangeSink::AddFileRange
                  (sink,"wasm_sections",name,(long)local_70.data._M_str - (long)pcVar1,
                   local_70.data._M_len);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
        operator_delete(local_70.name._M_dataplus._M_p,
                        local_70.name.field_2._M_allocated_capacity + 1);
      }
    } while (local_80._M_len != 0);
  }
  return;
}

Assistant:

void ParseSections(RangeSink* sink) {
  ForEachSection(sink->input_file().data(), [sink](const Section& section) {
    sink->AddFileRange("wasm_sections", section.name, section.data);
  });
}